

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this,
          WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  unsigned_short propertyIndex;
  int iVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<const_Js::PropertyRecord> local_28;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  PropertyAttributes local_19;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  WriteBarrierPtr<const_Js::PropertyRecord> *pWStack_18;
  PropertyAttributes attributes_local;
  WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  local_1c = usedAsFixed;
  local_1b = isFixed;
  local_1a = isInitialized;
  local_19 = attributes;
  pWStack_18 = propertyKey;
  propertyKey_local = (WriteBarrierPtr<const_Js::PropertyRecord> *)this;
  iVar4 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  if (0xfffe < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar1 = *(ushort *)(this + 0x2a);
  iVar4 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  if (iVar4 <= (int)(uint)uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  propertyIndex = ::Math::PostInc<unsigned_short>((unsigned_short *)(this + 0x2a));
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_28,propertyKey);
  Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
            (this,propertyIndex,&local_28,local_19,(bool)(local_1a & 1),(bool)(local_1b & 1),
             (bool)(local_1c & 1),scriptContext);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }